

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-close.c
# Opt level: O3

int run_test_shutdown_close_pipe(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_shutdown_t *puVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t h;
  void *local_100;
  undefined1 local_f8 [240];
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)(local_f8 + 8),0);
  local_f8._0_8_ = SEXT48(iVar1);
  local_100 = (void *)0x0;
  if ((void *)local_f8._0_8_ == (void *)0x0) {
    uv_pipe_connect(&connect_req,(uv_pipe_t *)(local_f8 + 8),"/tmp/uv-test-sock",connect_cb);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_f8._0_8_ = SEXT48(iVar1);
    local_100 = (void *)0x0;
    if ((void *)local_f8._0_8_ != (void *)0x0) goto LAB_001b7489;
    local_f8._0_8_ = (void *)0x1;
    local_100 = (void *)(long)connect_cb_called;
    if (local_100 != (void *)0x1) goto LAB_001b7498;
    local_f8._0_8_ = (void *)0x1;
    local_100 = (void *)(long)shutdown_cb_called;
    if (local_100 != (void *)0x1) goto LAB_001b74a7;
    local_f8._0_8_ = (void *)0x1;
    local_100 = (void *)(long)close_cb_called;
    if (local_100 == (void *)0x1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_f8._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      local_100 = (void *)(long)iVar1;
      if ((void *)local_f8._0_8_ == local_100) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b74c5;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_001b7489:
    run_test_shutdown_close_pipe_cold_2();
LAB_001b7498:
    run_test_shutdown_close_pipe_cold_3();
LAB_001b74a7:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_001b74c5:
  puVar3 = (uv_shutdown_t *)local_f8;
  iVar1 = (int)&local_100;
  run_test_shutdown_close_pipe_cold_6();
  if (puVar3 == &shutdown_req) {
    if ((iVar1 == -0x7d) || (iVar1 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(shutdown_close_pipe) {
  uv_pipe_t h;
  int r;

  r = uv_pipe_init(uv_default_loop(), &h, 0);
  ASSERT_OK(r);
  uv_pipe_connect(&connect_req, &h, TEST_PIPENAME, connect_cb);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}